

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O2

void absl::flags_internal::anon_unknown_0::FlagsHelpImpl
               (ostream *out,FlagKindFilter *filename_filter_cb,HelpFormat format,
               string_view program_usage_message)

{
  undefined4 in_register_00000014;
  char *in_R9;
  string_view program_usage_message_00;
  FlagKindFilter *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  program_usage_message_00._M_len = program_usage_message._M_str;
  local_20 = 0;
  local_10 = std::
             _Function_handler<bool_(const_absl::CommandLineFlag_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/flags/internal/usage.cc:342:7)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_absl::CommandLineFlag_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/flags/internal/usage.cc:342:7)>
             ::_M_manager;
  program_usage_message_00._M_str = in_R9;
  local_28 = filename_filter_cb;
  FlagsHelpImpl((anon_unknown_0 *)out,(ostream *)&local_28,
                (PerFlagFilter *)CONCAT44(in_register_00000014,format),
                (HelpFormat)program_usage_message._M_len,program_usage_message_00);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void FlagsHelpImpl(std::ostream& out,
                   flags_internal::FlagKindFilter filename_filter_cb,
                   HelpFormat format, absl::string_view program_usage_message) {
  FlagsHelpImpl(
      out,
      [&](const absl::CommandLineFlag& flag) {
        return filename_filter_cb && filename_filter_cb(flag.Filename());
      },
      format, program_usage_message);
}